

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseExprPrimary(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  char *pcVar5;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar4) {
    state_local._7_1_ = false;
  }
  else {
    uVar1 = ((guard.state_)->parse_state).mangled_idx;
    uVar2 = ((guard.state_)->parse_state).out_cur_idx;
    uVar3 = *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx;
    bVar4 = ParseTwoCharToken(guard.state_,"LZ");
    if (bVar4) {
      bVar4 = ParseEncoding(guard.state_);
      if ((bVar4) && (bVar4 = ParseOneCharToken(guard.state_,'E'), bVar4)) {
        state_local._7_1_ = true;
      }
      else {
        ((guard.state_)->parse_state).mangled_idx = uVar1;
        ((guard.state_)->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
        state_local._7_1_ = false;
      }
    }
    else {
      bVar4 = ParseOneCharToken(guard.state_,'L');
      if (bVar4) {
        bVar4 = ParseThreeCharToken(guard.state_,"DnE");
        if (bVar4) {
          state_local._7_1_ = true;
          goto LAB_00563bac;
        }
        pcVar5 = RemainingInput(guard.state_);
        if (*pcVar5 == 'A') {
          bVar4 = ParseType(guard.state_);
          if ((bVar4) && (bVar4 = ParseOneCharToken(guard.state_,'E'), bVar4)) {
            state_local._7_1_ = true;
          }
          else {
            ((guard.state_)->parse_state).mangled_idx = uVar1;
            ((guard.state_)->parse_state).out_cur_idx = uVar2;
            *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
            state_local._7_1_ = false;
          }
          goto LAB_00563bac;
        }
        bVar4 = ParseType(guard.state_);
        if ((bVar4) && (bVar4 = ParseExprCastValueAndTrailingE(guard.state_), bVar4)) {
          state_local._7_1_ = true;
          goto LAB_00563bac;
        }
      }
      ((guard.state_)->parse_state).mangled_idx = uVar1;
      ((guard.state_)->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
      bVar4 = ParseOneCharToken(guard.state_,'L');
      if (((bVar4) && (bVar4 = ParseMangledName(guard.state_), bVar4)) &&
         (bVar4 = ParseOneCharToken(guard.state_,'E'), bVar4)) {
        state_local._7_1_ = true;
      }
      else {
        ((guard.state_)->parse_state).mangled_idx = uVar1;
        ((guard.state_)->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
        state_local._7_1_ = false;
      }
    }
  }
LAB_00563bac:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseExprPrimary(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // The "LZ" special case: if we see LZ, we commit to accept "LZ <encoding> E"
  // or fail, no backtracking.
  if (ParseTwoCharToken(state, "LZ")) {
    if (ParseEncoding(state) && ParseOneCharToken(state, 'E')) {
      return true;
    }

    state->parse_state = copy;
    return false;
  }

  if (ParseOneCharToken(state, 'L')) {
    // There are two special cases in which a literal may or must contain a type
    // without a value.  The first is that both LDnE and LDn0E are valid
    // encodings of nullptr, used in different situations.  Recognize LDnE here,
    // leaving LDn0E to be recognized by the general logic afterward.
    if (ParseThreeCharToken(state, "DnE")) return true;

    // The second special case is a string literal, currently mangled in C++98
    // style as LA<length + 1>_KcE.  This is inadequate to support C++11 and
    // later versions, and the discussion of this problem has not converged.
    //
    // https://github.com/itanium-cxx-abi/cxx-abi/issues/64
    //
    // For now the bare-type mangling is what's used in practice, so we
    // recognize this form and only this form if an array type appears here.
    // Someday we'll probably have to accept a new form of value mangling in
    // LA...E constructs.  (Note also that C++20 allows a wide range of
    // class-type objects as template arguments, so someday their values will be
    // mangled and we'll have to recognize them here too.)
    if (RemainingInput(state)[0] == 'A' /* an array type follows */) {
      if (ParseType(state) && ParseOneCharToken(state, 'E')) return true;
      state->parse_state = copy;
      return false;
    }

    // The merged cast production.
    if (ParseType(state) && ParseExprCastValueAndTrailingE(state)) {
      return true;
    }
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'L') && ParseMangledName(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  return false;
}